

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::
int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::dec_writer::operator()
          (dec_writer *this,ostream_iterator<char,_char,_std::char_traits<char>_> *it)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  char_type buffer [26];
  ostream_iterator<char,_char,_std::char_traits<char>_> local_58;
  char local_48 [40];
  
  uVar6 = *(ulong *)this;
  iVar1 = *(int *)(this + 8);
  lVar8 = (long)iVar1;
  pcVar4 = local_48 + lVar8;
  uVar7 = uVar6;
  if (99 < uVar6) {
    do {
      uVar6 = uVar7 / 100;
      *(undefined2 *)(pcVar4 + -2) =
           *(undefined2 *)
            (internal::basic_data<void>::DIGITS + (ulong)(uint)((int)uVar7 + (int)uVar6 * -100) * 2)
      ;
      pcVar4 = pcVar4 + -2;
      bVar2 = 9999 < uVar7;
      uVar7 = uVar6;
    } while (bVar2);
  }
  local_58._M_stream = it->_M_stream;
  local_58._M_string = it->_M_string;
  if (uVar6 < 10) {
    bVar5 = (byte)uVar6 | 0x30;
    lVar3 = -1;
  }
  else {
    pcVar4[-1] = internal::basic_data<void>::DIGITS[(uVar6 * 2 & 0xffffffff) + 1];
    bVar5 = internal::basic_data<void>::DIGITS[uVar6 * 2 & 0x1fffffffe];
    lVar3 = -2;
  }
  pcVar4[lVar3] = bVar5;
  if (0 < iVar1) {
    pcVar4 = local_48;
    do {
      std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(&local_58,pcVar4);
      pcVar4 = pcVar4 + 1;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  it->_M_stream = local_58._M_stream;
  it->_M_string = local_58._M_string;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_decimal<char_type>(it, abs_value, num_digits);
      }